

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O1

void __thiscall backend::codegen::RegAllocator::add_reg_write(RegAllocator *this,Reg reg,uint point)

{
  int *piVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>,_bool>
  pVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_int>,_false,_false>,_bool> pVar9;
  Reg local_24;
  undefined8 local_20;
  
  uVar2 = (this->live_intervals)._M_h._M_bucket_count;
  uVar4 = (ulong)reg % uVar2;
  p_Var6 = (this->live_intervals)._M_h._M_buckets[uVar4];
  uVar5 = uVar4;
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(Reg *)&p_Var6->_M_nxt[1]._M_nxt != reg)) {
    while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      uVar5 = (ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2;
      p_Var7 = (__node_base_ptr)0x0;
      if ((uVar5 != uVar4) || (p_Var7 = p_Var6, *(uint *)&p_Var3[1]._M_nxt == reg))
      goto LAB_0017bbf1;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_0017bbf1:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var7->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    local_20 = CONCAT44(point,point);
    local_24 = reg;
    pVar8 = std::
            _Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_int_const,backend::codegen::Interval>>
                      ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->live_intervals);
    uVar5 = pVar8._8_8_;
  }
  else if (point < *(uint *)((long)&p_Var3[1]._M_nxt + 4)) {
    *(uint *)((long)&p_Var3[1]._M_nxt + 4) = point;
  }
  local_20 = CONCAT44(local_20._4_4_,1);
  local_24 = reg;
  pVar9 = std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,int>,std::allocator<std::pair<unsigned_int_const,int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_int_const,int>>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,int>,std::allocator<std::pair<unsigned_int_const,int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->reg_assign_count,&local_24,uVar5);
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    piVar1 = (int *)((long)pVar9.first.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_int>,_false>.
                           _M_cur.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_int>,_false> +
                    0xc);
    *piVar1 = *piVar1 + 1;
  }
  add_reg_use_in_bb_at_point(this,reg,point);
  return;
}

Assistant:

void add_reg_write(Reg reg, unsigned int point) {
    if (auto r = live_intervals.find(reg); r != live_intervals.end()) {
      r->second.add_starting_point(point);
    } else {
      live_intervals.insert({reg, Interval(point)});
    }
    auto r_use_insert = reg_assign_count.insert({reg, 1});
    if (!r_use_insert.second) {
      r_use_insert.first->second++;
    };
    add_reg_use_in_bb_at_point(reg, point);
  }